

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O2

void __thiscall vera::Material::set(Material *this,string *_property,float *_array1D,int _n)

{
  float fVar1;
  float *pfVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  ulong uVar6;
  vec<4,_float,_(glm::qualifier)0> local_48;
  
  local_48.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_48.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  local_48.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  local_48.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  uVar5 = 0;
  uVar6 = (ulong)(uint)_n;
  if (_n < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    fVar1 = _array1D[uVar5];
    pfVar2 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](&local_48,(length_type)uVar5);
    *pfVar2 = fVar1;
  }
  pmVar3 = std::
           map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<4,_float,_(glm::qualifier)0>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<4,_float,_(glm::qualifier)0>_>_>_>
           ::operator[](&this->colors,_property);
  pmVar3->field_0 = local_48.field_0;
  pmVar3->field_1 = local_48.field_1;
  pmVar3->field_2 = local_48.field_2;
  pmVar3->field_3 = local_48.field_3;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::MaterialPropertyType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::MaterialPropertyType>_>_>
           ::operator[](&this->properties,_property);
  *pmVar4 = COLOR;
  return;
}

Assistant:

void Material::set(const std::string& _property, const float* _array1D, int _n) {
    glm::vec4 color = glm::vec4(0.0f, 0.0f, 0.0f, 1.0f);
    for (int i = 0; i < _n; i++)
        color[i] = _array1D[i];
    
    colors[_property] = color;
    properties[_property] = COLOR;
}